

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O0

void TestConstExpr::ConstCastTestT<unsigned_int>(void)

{
  int iVar1;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  *in_stack_ffffffffffffff10;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  uint local_28;
  uint local_24;
  uint local_20;
  uint local_1c;
  uint local_18;
  uint local_4;
  
  if (ConstCastTestT<unsigned_int>()::b == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_int>()::b);
    if (iVar1 != 0) {
      local_4 = (uint)ConstSafeInt<unsigned_int>();
      ConstCastTestT<unsigned_int>::b = ::SafeInt::operator_cast_to_bool((SafeInt *)&local_4);
      __cxa_guard_release(&ConstCastTestT<unsigned_int>()::b);
    }
  }
  if (ConstCastTestT<unsigned_int>()::w == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_int>()::w);
    if (iVar1 != 0) {
      local_18 = (uint)ConstSafeInt<unsigned_int>();
      ConstCastTestT<unsigned_int>::w =
           ::SafeInt::operator_cast_to_wchar_t(in_stack_ffffffffffffff10);
      __cxa_guard_release(&ConstCastTestT<unsigned_int>()::w);
    }
  }
  if (ConstCastTestT<unsigned_int>()::c == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_int>()::c);
    if (iVar1 != 0) {
      local_1c = (uint)ConstSafeInt<unsigned_int>();
      ConstCastTestT<unsigned_int>::c = ::SafeInt::operator_cast_to_char(in_stack_ffffffffffffff10);
      __cxa_guard_release(&ConstCastTestT<unsigned_int>()::c);
    }
  }
  if (ConstCastTestT<unsigned_int>()::sc == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_int>()::sc);
    if (iVar1 != 0) {
      local_20 = (uint)ConstSafeInt<unsigned_int>();
      ConstCastTestT<unsigned_int>::sc =
           ::SafeInt::operator_cast_to_signed_char(in_stack_ffffffffffffff10);
      __cxa_guard_release(&ConstCastTestT<unsigned_int>()::sc);
    }
  }
  if (ConstCastTestT<unsigned_int>()::uc == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_int>()::uc);
    if (iVar1 != 0) {
      local_24 = (uint)ConstSafeInt<unsigned_int>();
      ConstCastTestT<unsigned_int>::uc =
           ::SafeInt::operator_cast_to_unsigned_char(in_stack_ffffffffffffff10);
      __cxa_guard_release(&ConstCastTestT<unsigned_int>()::uc);
    }
  }
  if (ConstCastTestT<unsigned_int>()::s == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_int>()::s);
    if (iVar1 != 0) {
      local_28 = (uint)ConstSafeInt<unsigned_int>();
      ConstCastTestT<unsigned_int>::s = ::SafeInt::operator_cast_to_short(in_stack_ffffffffffffff10)
      ;
      __cxa_guard_release(&ConstCastTestT<unsigned_int>()::s);
    }
  }
  if (ConstCastTestT<unsigned_int>()::us == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_int>()::us);
    if (iVar1 != 0) {
      local_2c = (uint)ConstSafeInt<unsigned_int>();
      ConstCastTestT<unsigned_int>::us =
           ::SafeInt::operator_cast_to_unsigned_short(in_stack_ffffffffffffff10);
      __cxa_guard_release(&ConstCastTestT<unsigned_int>()::us);
    }
  }
  if (ConstCastTestT<unsigned_int>()::i == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_int>()::i);
    if (iVar1 != 0) {
      local_30 = (uint)ConstSafeInt<unsigned_int>();
      ConstCastTestT<unsigned_int>::i = ::SafeInt::operator_cast_to_int(in_stack_ffffffffffffff10);
      __cxa_guard_release(&ConstCastTestT<unsigned_int>()::i);
    }
  }
  if (ConstCastTestT<unsigned_int>()::ui == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_int>()::ui);
    if (iVar1 != 0) {
      local_34 = (uint)ConstSafeInt<unsigned_int>();
      ConstCastTestT<unsigned_int>::ui =
           ::SafeInt::operator_cast_to_unsigned_int(in_stack_ffffffffffffff10);
      __cxa_guard_release(&ConstCastTestT<unsigned_int>()::ui);
    }
  }
  if (ConstCastTestT<unsigned_int>()::l == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_int>()::l);
    if (iVar1 != 0) {
      local_38 = (uint)ConstSafeInt<unsigned_int>();
      ConstCastTestT<unsigned_int>::l = ::SafeInt::operator_cast_to_long(in_stack_ffffffffffffff10);
      __cxa_guard_release(&ConstCastTestT<unsigned_int>()::l);
    }
  }
  if (ConstCastTestT<unsigned_int>()::ul == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_int>()::ul);
    if (iVar1 != 0) {
      local_3c = (uint)ConstSafeInt<unsigned_int>();
      ConstCastTestT<unsigned_int>::ul =
           ::SafeInt::operator_cast_to_unsigned_long(in_stack_ffffffffffffff10);
      __cxa_guard_release(&ConstCastTestT<unsigned_int>()::ul);
    }
  }
  if (ConstCastTestT<unsigned_int>()::ll == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_int>()::ll);
    if (iVar1 != 0) {
      local_40 = (uint)ConstSafeInt<unsigned_int>();
      ConstCastTestT<unsigned_int>::ll =
           ::SafeInt::operator_cast_to_long_long(in_stack_ffffffffffffff10);
      __cxa_guard_release(&ConstCastTestT<unsigned_int>()::ll);
    }
  }
  if (ConstCastTestT<unsigned_int>()::ull == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_int>()::ull);
    if (iVar1 != 0) {
      local_44 = (uint)ConstSafeInt<unsigned_int>();
      ConstCastTestT<unsigned_int>::ull =
           ::SafeInt::operator_cast_to_unsigned_long_long(in_stack_ffffffffffffff10);
      __cxa_guard_release(&ConstCastTestT<unsigned_int>()::ull);
    }
  }
  if (ConstCastTestT<unsigned_int>()::st == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_int>()::st);
    if (iVar1 != 0) {
      local_48 = (uint)ConstSafeInt<unsigned_int>();
      ConstCastTestT<unsigned_int>::st =
           ::SafeInt::operator_cast_to_unsigned_long(in_stack_ffffffffffffff10);
      __cxa_guard_release(&ConstCastTestT<unsigned_int>()::st);
    }
  }
  if (ConstCastTestT<unsigned_int>()::pt == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_int>()::pt);
    if (iVar1 != 0) {
      local_4c = (uint)ConstSafeInt<unsigned_int>();
      ConstCastTestT<unsigned_int>::pt = ::SafeInt::operator_cast_to_long(in_stack_ffffffffffffff10)
      ;
      in_stack_ffffffffffffff10 =
           (SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
            *)ConstCastTestT<unsigned_int>::pt;
      __cxa_guard_release(&ConstCastTestT<unsigned_int>()::pt);
    }
  }
  if (ConstCastTestT<unsigned_int>()::pl == '\0') {
    iVar1 = __cxa_guard_acquire(&ConstCastTestT<unsigned_int>()::pl);
    if (iVar1 != 0) {
      local_50 = ConstSafeInt<unsigned_int>();
      SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
      ::operator+(&local_50);
      ConstCastTestT<unsigned_int>::pl = ::SafeInt::operator_cast_to_int(in_stack_ffffffffffffff10);
      __cxa_guard_release(&ConstCastTestT<unsigned_int>()::pl);
    }
  }
  return;
}

Assistant:

void ConstCastTestT()
	{
		static const bool b = ConstSafeInt<T>();
		static const wchar_t w = ConstSafeInt<T>();
		static const char c = ConstSafeInt<T>();
		static const signed char sc = ConstSafeInt<T>();
		static const unsigned char uc = ConstSafeInt<T>();
		static const signed short s = ConstSafeInt<T>();
		static const unsigned short us = ConstSafeInt<T>();
		static const signed int i = ConstSafeInt<T>();
		static const unsigned int ui = ConstSafeInt<T>();
		static const signed long l = ConstSafeInt<T>();
		static const unsigned long ul = ConstSafeInt<T>();
		static const signed long long ll = ConstSafeInt<T>();
		static const unsigned long long ull = ConstSafeInt<T>();
		static const size_t st = ConstSafeInt<T>();
		static const ptrdiff_t pt = ConstSafeInt<T>();

		// Also catch the useless unary + operator
		static const int pl = +ConstSafeInt<T>();
	}